

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9MLTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int nArgcNew;
  char **pArgvNew;
  char *pDumpFile;
  int fVerbose;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  pArgvNew = (char **)0x0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"Dvh");
      if (iVar2 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9MLTest(): There is no AIG.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          iVar2 = Gia_ManRegNum(pAbc->pGia);
          if (iVar2 < 1) {
            Vec_WrdFreeP(&pAbc->pGia->vSimsPi);
            if (argc - globalUtilOptind == 1) {
              Gia_ManTestOneFile(pAbc->pGia,argv[globalUtilOptind],(char *)pArgvNew);
              pAbc_local._4_4_ = 0;
            }
            else {
              Abc_Print(-1,
                        "Abc_CommandAbc9MLTest(): Expecting data file name on the command line.\n");
              pAbc_local._4_4_ = 0;
            }
          }
          else {
            Abc_Print(-1,
                      "Abc_CommandAbc9MLTest(): This command works only for combinational AIGs.\n");
            pAbc_local._4_4_ = 0;
          }
        }
        return pAbc_local._4_4_;
      }
      if (iVar2 != 0x44) break;
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by a file name.\n");
        goto LAB_002a3d02;
      }
      pArgvNew = (char **)argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
    if ((iVar2 == 0x68) || (iVar2 != 0x76)) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
LAB_002a3d02:
  Abc_Print(-2,"usage: &mltest [-vh] [-D file] <file>\n");
  Abc_Print(-2,"\t          testing command for machine learning data\n");
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h      : print the command usage\n");
  Abc_Print(-2,"\t-D file : file name to dump statistics [default = none]\n");
  Abc_Print(-2,"\tfile    : file with input simulation info\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9MLTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManTestOneFile( Gia_Man_t * p, char * pFileName, char * pDumpFile );
    int c, fVerbose = 0;
    char * pDumpFile = NULL;
    char ** pArgvNew;
    int nArgcNew;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Dvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a file name.\n" );
                goto usage;
            }
            pDumpFile = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MLTest(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9MLTest(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9MLTest(): Expecting data file name on the command line.\n" );
        return 0;
    }
    Gia_ManTestOneFile( pAbc->pGia, pArgvNew[0], pDumpFile );
    return 0;

usage:
    Abc_Print( -2, "usage: &mltest [-vh] [-D file] <file>\n" );
    Abc_Print( -2, "\t          testing command for machine learning data\n" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t-D file : file name to dump statistics [default = none]\n" );
    Abc_Print( -2, "\tfile    : file with input simulation info\n");
    return 1;
}